

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall libtorrent::aux::session_impl::add_dht_node(session_impl *this,endpoint *n)

{
  pointer *ppbVar1;
  pointer pbVar2;
  undefined8 *puVar3;
  dht_tracker *this_00;
  iterator __position;
  pointer pbVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  
  this_00 = (this->m_dht).
            super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (dht_tracker *)0x0) {
    libtorrent::dht::dht_tracker::add_node(this_00,n);
    return;
  }
  __position._M_current =
       (this->m_dht_nodes).
       super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = ((long)__position._M_current -
           (long)(this->m_dht_nodes).
                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7;
  if (uVar8 < 200) {
    if (__position._M_current ==
        (this->m_dht_nodes).
        super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>
      ::_M_realloc_insert<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&>
                ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>
                  *)&this->m_dht_nodes,__position,n);
      return;
    }
    uVar5 = *(undefined8 *)&(n->impl_).data_;
    uVar6 = *(undefined8 *)((long)&(n->impl_).data_ + 8);
    uVar7 = *(undefined8 *)((long)&(n->impl_).data_ + 0x14);
    *(undefined8 *)((long)&((__position._M_current)->impl_).data_ + 0xc) =
         *(undefined8 *)((long)&(n->impl_).data_ + 0xc);
    *(undefined8 *)((long)&((__position._M_current)->impl_).data_ + 0x14) = uVar7;
    *(undefined8 *)&((__position._M_current)->impl_).data_ = uVar5;
    *(undefined8 *)((long)&((__position._M_current)->impl_).data_ + 8) = uVar6;
    ppbVar1 = &(this->m_dht_nodes).
               super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppbVar1 = *ppbVar1 + 1;
  }
  else {
    uVar8 = random((aux *)(ulong)((int)uVar8 - 1));
    pbVar4 = (this->m_dht_nodes).
             super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = *(undefined8 *)((long)&(n->impl_).data_ + 8);
    uVar6 = *(undefined8 *)((long)&(n->impl_).data_ + 0xc);
    uVar7 = *(undefined8 *)((long)&(n->impl_).data_ + 0x14);
    pbVar2 = pbVar4 + (uVar8 & 0xffffffff);
    *(undefined8 *)&(pbVar2->impl_).data_ = *(undefined8 *)&(n->impl_).data_;
    *(undefined8 *)((long)&(pbVar2->impl_).data_ + 8) = uVar5;
    puVar3 = (undefined8 *)((long)&pbVar4[uVar8 & 0xffffffff].impl_.data_ + 0xc);
    *puVar3 = uVar6;
    puVar3[1] = uVar7;
  }
  return;
}

Assistant:

void session_impl::add_dht_node(udp::endpoint const& n)
	{
		TORRENT_ASSERT(is_single_thread());
		if (m_dht)
			m_dht->add_node(n);
		else if (m_dht_nodes.size() >= 200)
			m_dht_nodes[random(std::uint32_t(m_dht_nodes.size() - 1))] = n;
		else
			m_dht_nodes.push_back(n);
	}